

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O3

void av1_convolve_x_sr_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  undefined8 uVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [13];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [11];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined3 uVar51;
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  uint7 uVar84;
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [13];
  undefined1 auVar111 [13];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [13];
  undefined4 uVar126;
  undefined4 uVar127;
  undefined4 uVar128;
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  undefined1 auVar132 [15];
  undefined1 auVar133 [15];
  undefined1 auVar134 [15];
  undefined1 auVar135 [13];
  undefined1 auVar136 [13];
  undefined1 auVar137 [13];
  unkuint9 Var138;
  undefined1 auVar139 [13];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [11];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [15];
  undefined1 auVar147 [12];
  undefined1 auVar148 [12];
  undefined1 auVar149 [14];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [13];
  undefined3 uVar162;
  undefined1 auVar163 [15];
  undefined1 auVar164 [15];
  undefined1 auVar165 [15];
  undefined1 auVar166 [15];
  undefined1 auVar167 [15];
  undefined1 auVar168 [15];
  undefined1 auVar169 [15];
  undefined1 auVar170 [15];
  undefined1 auVar171 [15];
  undefined1 auVar172 [15];
  undefined1 auVar173 [15];
  undefined1 auVar174 [15];
  undefined1 auVar175 [15];
  undefined1 auVar176 [15];
  undefined1 auVar177 [15];
  undefined1 auVar178 [15];
  undefined1 auVar179 [15];
  undefined1 auVar180 [15];
  undefined1 auVar181 [15];
  undefined1 auVar182 [15];
  undefined1 auVar183 [15];
  undefined1 auVar184 [15];
  undefined1 auVar185 [15];
  undefined1 auVar186 [15];
  undefined1 auVar187 [15];
  undefined1 auVar188 [15];
  undefined1 auVar189 [15];
  undefined1 auVar190 [15];
  undefined5 uVar191;
  undefined1 auVar192 [12];
  undefined1 auVar193 [12];
  undefined1 auVar194 [14];
  undefined1 auVar195 [14];
  uint5 uVar196;
  undefined1 (*pauVar197) [16];
  uint8_t *puVar198;
  ulong uVar199;
  ulong uVar200;
  uint uVar201;
  ulong uVar202;
  int iVar203;
  int iVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined4 uVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 uVar232;
  undefined1 uVar233;
  undefined1 uVar234;
  undefined1 uVar235;
  undefined1 uVar236;
  undefined1 auVar222 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  uint3 uVar237;
  undefined1 auVar238 [12];
  undefined1 uVar248;
  undefined1 uVar250;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  ushort uVar261;
  ushort uVar263;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  byte bVar272;
  byte bVar273;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 uVar219;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined2 uVar249;
  undefined1 uVar262;
  undefined1 uVar264;
  
  uVar261 = filter_params_x->taps;
  if (uVar261 < 9) {
    pauVar197 = (undefined1 (*) [16])(src + (1 - (ulong)(uVar261 >> 1)));
    uVar201 = 7 - conv_params->round_0;
    iVar203 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    iVar204 = (1 << ((byte)uVar201 & 0x1f)) >> 1;
    auVar205 = ZEXT416((uint)conv_params->round_0);
    auVar206 = ZEXT416(uVar201);
    piVar1 = filter_params_x->filter_ptr + (uint)uVar261 * (subpel_x_qn & 0xfU);
    uVar126 = *(undefined4 *)piVar1;
    uVar127 = *(undefined4 *)(piVar1 + 2);
    uVar128 = *(undefined4 *)(piVar1 + 4);
    uVar209 = *(undefined4 *)(piVar1 + 6);
    auVar227._4_4_ = uVar209;
    auVar227._0_4_ = uVar209;
    auVar227._8_4_ = uVar209;
    auVar227._12_4_ = uVar209;
    if (w < 5) {
      do {
        auVar245 = *pauVar197;
        bVar273 = auVar245[7];
        auVar20[0xd] = 0;
        auVar20._0_13_ = auVar245._0_13_;
        auVar20[0xe] = bVar273;
        uVar232 = auVar245[6];
        auVar37[0xc] = uVar232;
        auVar37._0_12_ = auVar245._0_12_;
        auVar37._13_2_ = auVar20._13_2_;
        uVar51 = auVar37._12_3_;
        auVar52[0xb] = 0;
        auVar52._0_11_ = auVar245._0_11_;
        auVar52._12_3_ = uVar51;
        uVar219 = auVar245[5];
        auVar67[10] = uVar219;
        auVar67._0_10_ = auVar245._0_10_;
        auVar67._11_4_ = auVar52._11_4_;
        auVar81[9] = 0;
        auVar81._0_9_ = auVar245._0_9_;
        auVar81._10_5_ = auVar67._10_5_;
        bVar272 = auVar245[4];
        auVar97[8] = bVar272;
        auVar97._0_8_ = auVar245._0_8_;
        auVar97._9_6_ = auVar81._9_6_;
        auVar213[7] = 0;
        auVar213._0_7_ = auVar97._8_7_;
        auVar129._7_8_ = 0;
        auVar129._0_7_ = auVar97._8_7_;
        auVar130._8_7_ = 0;
        auVar130._0_8_ = SUB158(auVar129 << 0x40,7);
        auVar131._9_6_ = 0;
        auVar131._0_9_ = SUB159(auVar130 << 0x38,6);
        auVar132._10_5_ = 0;
        auVar132._0_10_ = SUB1510(auVar131 << 0x30,5);
        auVar133._11_4_ = 0;
        auVar133._0_11_ = SUB1511(auVar132 << 0x28,4);
        auVar134._12_3_ = 0;
        auVar134._0_12_ = SUB1512(auVar133 << 0x20,3);
        auVar124._13_2_ = 0;
        auVar124._0_13_ = SUB1513(auVar134 << 0x18,2);
        auVar124 = auVar124 << 0x10;
        uVar237 = CONCAT12(auVar245[9],(ushort)auVar245[8]);
        auVar239._0_4_ = CONCAT13(0,uVar237);
        auVar31[0xb] = 0;
        auVar31._0_11_ = auVar124._0_11_;
        auVar31[0xc] = auVar245[3];
        auVar110[10] = 0;
        auVar110._0_10_ = auVar124._0_10_;
        auVar110._11_2_ = auVar31._11_2_;
        auVar111[9] = 0;
        auVar111._0_9_ = auVar124._0_9_;
        auVar111._10_3_ = auVar110._10_3_;
        uVar196 = CONCAT41(auVar111._9_4_,auVar245[2]);
        auVar135._5_8_ = 0;
        auVar135._0_5_ = uVar196;
        auVar136._6_7_ = 0;
        auVar136._0_6_ = SUB136(auVar135 << 0x40,7);
        auVar137._7_6_ = 0;
        auVar137._0_7_ = SUB137(auVar136 << 0x38,6);
        Var138 = CONCAT81(SUB138(auVar137 << 0x30,5),auVar245[1]);
        auVar161._9_4_ = 0;
        auVar161._0_9_ = Var138;
        auVar139._10_3_ = 0;
        auVar139._0_10_ = SUB1310(auVar161 << 0x20,3);
        auVar125._2_11_ = SUB1311(auVar139 << 0x18,2);
        auVar125._0_2_ = auVar245._0_2_ & 0xff;
        auVar265._13_3_ = 0;
        auVar265._0_13_ = auVar125;
        auVar210._1_3_ = 0;
        auVar210[0] = bVar272;
        auVar210[4] = uVar219;
        auVar210._5_3_ = 0;
        auVar210[8] = uVar232;
        auVar210._9_3_ = 0;
        auVar210[0xc] = bVar273;
        auVar210._13_3_ = 0;
        auVar254 = pshuflw(in_XMM10,auVar210,0xec);
        auVar256 = auVar210 & _DAT_0056c7b0 | ~_DAT_0056c7b0 & auVar265;
        auVar251._0_4_ = auVar256._0_4_;
        auVar251._12_4_ = auVar256._12_4_;
        auVar251._4_4_ = auVar256._8_4_;
        auVar251._8_4_ = auVar256._4_4_;
        auVar256 = pshuflw(auVar251,auVar251,0xc6);
        auVar256 = pshufhw(auVar256,auVar256,0xe6);
        auVar252._0_4_ = auVar256._0_4_;
        auVar252._12_4_ = auVar256._12_4_;
        auVar252._4_4_ = auVar256._8_4_;
        auVar252._8_4_ = auVar256._4_4_;
        auVar256 = pshufhw(auVar252,auVar252,0xc6);
        auVar266._4_4_ = (undefined4)Var138;
        auVar266._0_4_ = (int)uVar196;
        auVar266._8_4_ = auVar125._0_4_;
        auVar266[0xc] = auVar245[3];
        auVar266._13_3_ = 0;
        auVar271 = pshufhw(~_DAT_0056c7b0 & auVar265,auVar266,0xec);
        auVar274._4_4_ = auVar271._4_4_;
        auVar274._0_4_ = auVar271._8_4_;
        auVar274._8_4_ = auVar274._4_4_;
        auVar274._12_4_ = auVar271._0_4_;
        auVar271 = pshuflw(auVar274,auVar274,0x6c);
        auVar271 = auVar271 & _DAT_0056c7c0;
        sVar4 = auVar271._0_2_;
        sVar5 = auVar271._2_2_;
        auVar275[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar271[2] - (0xff < sVar5);
        auVar275[0] = (0 < sVar4) * (sVar4 < 0x100) * auVar271[0] - (0xff < sVar4);
        sVar4 = auVar271._4_2_;
        auVar275[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar271[4] - (0xff < sVar4);
        sVar4 = auVar271._6_2_;
        auVar275[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar271[6] - (0xff < sVar4);
        sVar4 = auVar271._8_2_;
        auVar275[4] = (0 < sVar4) * (sVar4 < 0x100) * auVar271[8] - (0xff < sVar4);
        sVar4 = auVar271._10_2_;
        auVar275[5] = (0 < sVar4) * (sVar4 < 0x100) * auVar271[10] - (0xff < sVar4);
        sVar4 = auVar271._12_2_;
        auVar275[6] = (0 < sVar4) * (sVar4 < 0x100) * auVar271[0xc] - (0xff < sVar4);
        sVar4 = auVar271._14_2_;
        auVar275[7] = (0 < sVar4) * (sVar4 < 0x100) * auVar271[0xe] - (0xff < sVar4);
        sVar4 = auVar256._0_2_;
        auVar275[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[0] - (0xff < sVar4);
        sVar4 = auVar256._2_2_;
        auVar275[9] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[2] - (0xff < sVar4);
        sVar4 = auVar256._4_2_;
        auVar275[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[4] - (0xff < sVar4);
        sVar4 = auVar256._6_2_;
        auVar275[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[6] - (0xff < sVar4);
        sVar4 = auVar256._8_2_;
        auVar275[0xc] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[8] - (0xff < sVar4);
        sVar4 = auVar256._10_2_;
        auVar275[0xd] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[10] - (0xff < sVar4);
        sVar4 = auVar256._12_2_;
        auVar275[0xe] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[0xc] - (0xff < sVar4);
        sVar4 = auVar256._14_2_;
        auVar275[0xf] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[0xe] - (0xff < sVar4);
        auVar220._12_4_ = auVar254._12_4_;
        auVar220._0_8_ = auVar254._0_8_;
        auVar220._8_4_ = auVar254._0_4_;
        auVar254 = pshufhw(auVar220,auVar220,0xc4);
        in_XMM10 = pshuflw(auVar254,auVar266,0xec);
        uVar209 = in_XMM10._12_4_;
        auVar267._4_4_ = uVar209;
        auVar267._0_4_ = in_XMM10._0_4_;
        auVar267._8_4_ = uVar209;
        auVar267._12_4_ = uVar209;
        auVar256 = auVar267 & _DAT_0056c7d0 | ~_DAT_0056c7d0 & auVar254;
        auVar211._1_3_ = 0;
        auVar211[0] = bVar273;
        auVar211[4] = uVar219;
        auVar211._5_3_ = 0;
        auVar211[8] = uVar232;
        auVar211._9_3_ = 0;
        auVar211[0xc] = bVar272;
        auVar211._13_3_ = 0;
        auVar254 = pshuflw(auVar211,auVar211,0xe6);
        auVar212._4_4_ = auVar254._4_4_;
        auVar212._8_4_ = auVar254._8_4_;
        auVar212._0_4_ = auVar254._12_4_;
        auVar212._12_4_ = auVar254._0_4_;
        auVar254 = pshufhw(auVar212,auVar212,0xc6);
        sVar4 = auVar256._0_2_;
        sVar5 = auVar256._2_2_;
        auVar268[1] = (0 < sVar5) * (sVar5 < 0x100) * auVar256[2] - (0xff < sVar5);
        auVar268[0] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[0] - (0xff < sVar4);
        sVar4 = auVar256._4_2_;
        auVar268[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[4] - (0xff < sVar4);
        sVar4 = auVar256._6_2_;
        auVar268[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[6] - (0xff < sVar4);
        sVar4 = auVar256._8_2_;
        auVar268[4] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[8] - (0xff < sVar4);
        sVar4 = auVar256._10_2_;
        auVar268[5] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[10] - (0xff < sVar4);
        sVar4 = auVar256._12_2_;
        auVar268[6] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[0xc] - (0xff < sVar4);
        sVar4 = auVar256._14_2_;
        auVar268[7] = (0 < sVar4) * (sVar4 < 0x100) * auVar256[0xe] - (0xff < sVar4);
        sVar4 = auVar254._0_2_;
        auVar268[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar254[0] - (0xff < sVar4);
        sVar4 = auVar254._2_2_;
        auVar268[9] = (0 < sVar4) * (sVar4 < 0x100) * auVar254[2] - (0xff < sVar4);
        sVar4 = auVar254._4_2_;
        auVar268[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar254[4] - (0xff < sVar4);
        sVar4 = auVar254._6_2_;
        auVar268[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar254[6] - (0xff < sVar4);
        sVar4 = auVar254._8_2_;
        auVar268[0xc] = (0 < sVar4) * (sVar4 < 0x100) * auVar254[8] - (0xff < sVar4);
        sVar4 = auVar254._10_2_;
        auVar268[0xd] = (0 < sVar4) * (sVar4 < 0x100) * auVar254[10] - (0xff < sVar4);
        sVar4 = auVar254._12_2_;
        auVar268[0xe] = (0 < sVar4) * (sVar4 < 0x100) * auVar254[0xc] - (0xff < sVar4);
        sVar4 = auVar254._14_2_;
        auVar268[0xf] = (0 < sVar4) * (sVar4 < 0x100) * auVar254[0xe] - (0xff < sVar4);
        auVar213._8_3_ = uVar237;
        auVar213[0xb] = 0;
        auVar213._12_3_ = uVar51;
        auVar213[0xf] = 0;
        auVar254 = pshuflw(auVar213,auVar213,0x94);
        auVar254 = pshufhw(auVar254,auVar254,0x3e);
        sVar4 = auVar254._0_2_;
        sVar5 = auVar254._2_2_;
        sVar6 = auVar254._4_2_;
        sVar7 = auVar254._6_2_;
        sVar8 = auVar254._8_2_;
        sVar9 = auVar254._10_2_;
        sVar10 = auVar254._12_2_;
        sVar11 = auVar254._14_2_;
        cVar3 = (0 < sVar11) * (sVar11 < 0x100) * auVar254[0xe] - (0xff < sVar11);
        uVar261 = CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar254[0] - (0xff < sVar4),cVar3);
        uVar162 = CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar254[2] - (0xff < sVar5),uVar261);
        uVar201 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar254[4] - (0xff < sVar6),uVar162);
        uVar191 = CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar254[6] - (0xff < sVar7),uVar201);
        auVar194[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar254[8] - (0xff < sVar8);
        auVar194._0_5_ = uVar191;
        auVar194._6_8_ = 0;
        auVar21[0xe] = cVar3;
        auVar21._0_14_ = auVar194 << 0x38;
        auVar192._4_8_ = 0;
        auVar192._0_4_ = uVar201;
        auVar53._12_3_ =
             (int3)(CONCAT26(auVar21._13_2_,
                             CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar254[0xc] -
                                      (0xff < sVar10),uVar191)) >> 0x28);
        auVar53._0_12_ = auVar192 << 0x38;
        auVar82._10_5_ =
             (int5)(CONCAT44(auVar53._11_4_,
                             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar254[10] - (0xff < sVar9),
                                      uVar162)) >> 0x18);
        auVar82._0_10_ = (unkuint10)uVar261 << 0x38;
        auVar140._7_8_ = 0;
        auVar140._0_7_ =
             (uint7)(CONCAT62(auVar82._9_6_,
                              CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar254[8] - (0xff < sVar8),
                                       cVar3)) >> 8);
        auVar163._1_8_ = SUB158(auVar140 << 0x40,7);
        auVar163[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar254[6] - (0xff < sVar7);
        auVar163._9_6_ = 0;
        auVar164._1_10_ = SUB1510(auVar163 << 0x30,5);
        auVar164[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar254[4] - (0xff < sVar6);
        auVar164._11_4_ = 0;
        auVar214._3_12_ = SUB1512(auVar164 << 0x20,3);
        auVar214[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar254[2] - (0xff < sVar5);
        auVar214[1] = 0;
        auVar214[0] = (0 < sVar4) * (sVar4 < 0x100) * auVar254[0] - (0xff < sVar4);
        auVar214[0xf] = 0;
        auVar15._4_4_ = uVar127;
        auVar15._0_4_ = uVar127;
        auVar15._8_4_ = uVar127;
        auVar15._12_4_ = uVar127;
        auVar256 = pmaddwd(auVar268,auVar15);
        auVar17._4_4_ = uVar128;
        auVar17._0_4_ = uVar128;
        auVar17._8_4_ = uVar128;
        auVar17._12_4_ = uVar128;
        auVar254 = pmaddwd(auVar214,auVar17);
        auVar239._4_3_ = uVar51;
        auVar239[7] = 0;
        auVar239._8_3_ = uVar237;
        auVar239[0xb] = 0;
        auVar239._12_3_ =
             (int3)(CONCAT16(auVar245[0xb],(uint6)CONCAT14(auVar245[10],auVar239._0_4_)) >> 0x20);
        auVar239[0xf] = 0;
        auVar245 = pshuflw(auVar254,auVar239,0x3e);
        auVar245 = pshufhw(auVar245,auVar245,0x94);
        sVar4 = auVar245._0_2_;
        sVar5 = auVar245._2_2_;
        sVar6 = auVar245._4_2_;
        sVar7 = auVar245._6_2_;
        sVar8 = auVar245._8_2_;
        sVar9 = auVar245._10_2_;
        sVar10 = auVar245._12_2_;
        sVar11 = auVar245._14_2_;
        cVar3 = (0 < sVar11) * (sVar11 < 0x100) * auVar245[0xe] - (0xff < sVar11);
        uVar261 = CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar245[0] - (0xff < sVar4),cVar3);
        uVar51 = CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar245[2] - (0xff < sVar5),uVar261);
        uVar201 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar245[4] - (0xff < sVar6),uVar51);
        uVar191 = CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar245[6] - (0xff < sVar7),uVar201);
        auVar195[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar245[8] - (0xff < sVar8);
        auVar195._0_5_ = uVar191;
        auVar195._6_8_ = 0;
        auVar22[0xe] = cVar3;
        auVar22._0_14_ = auVar195 << 0x38;
        auVar193._4_8_ = 0;
        auVar193._0_4_ = uVar201;
        auVar54._12_3_ =
             (int3)(CONCAT26(auVar22._13_2_,
                             CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar245[0xc] -
                                      (0xff < sVar10),uVar191)) >> 0x28);
        auVar54._0_12_ = auVar193 << 0x38;
        auVar83._10_5_ =
             (int5)(CONCAT44(auVar54._11_4_,
                             CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar245[10] - (0xff < sVar9),
                                      uVar51)) >> 0x18);
        auVar83._0_10_ = (unkuint10)uVar261 << 0x38;
        auVar141._7_8_ = 0;
        auVar141._0_7_ =
             (uint7)(CONCAT62(auVar83._9_6_,
                              CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar245[8] - (0xff < sVar8),
                                       cVar3)) >> 8);
        auVar165._1_8_ = SUB158(auVar141 << 0x40,7);
        auVar165[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar245[6] - (0xff < sVar7);
        auVar165._9_6_ = 0;
        auVar166._1_10_ = SUB1510(auVar165 << 0x30,5);
        auVar166[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar245[4] - (0xff < sVar6);
        auVar166._11_4_ = 0;
        auVar215._3_12_ = SUB1512(auVar166 << 0x20,3);
        auVar215[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar245[2] - (0xff < sVar5);
        auVar215[1] = 0;
        auVar215[0] = (0 < sVar4) * (sVar4 < 0x100) * auVar245[0] - (0xff < sVar4);
        auVar215[0xf] = 0;
        auVar245 = pmaddwd(auVar215,auVar227);
        auVar13._4_4_ = uVar126;
        auVar13._0_4_ = uVar126;
        auVar13._8_4_ = uVar126;
        auVar13._12_4_ = uVar126;
        auVar271 = pmaddwd(auVar275,auVar13);
        auVar269._0_4_ =
             (auVar256._0_4_ + iVar203 + auVar254._0_4_ + auVar245._0_4_ + auVar271._0_4_ >>
             auVar205) + iVar204 >> auVar206;
        auVar269._4_4_ =
             (auVar256._4_4_ + iVar203 + auVar254._4_4_ + auVar245._4_4_ + auVar271._4_4_ >>
             auVar205) + iVar204 >> auVar206;
        auVar269._8_4_ =
             (auVar256._8_4_ + iVar203 + auVar254._8_4_ + auVar245._8_4_ + auVar271._8_4_ >>
             auVar205) + iVar204 >> auVar206;
        auVar269._12_4_ =
             (auVar256._12_4_ + iVar203 + auVar254._12_4_ + auVar245._12_4_ + auVar271._12_4_ >>
             auVar205) + iVar204 >> auVar206;
        auVar245 = packssdw(auVar269,auVar269);
        sVar4 = auVar245._0_2_;
        sVar5 = auVar245._2_2_;
        uVar249 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar245[2] - (0xff < sVar5),
                           (0 < sVar4) * (sVar4 < 0x100) * auVar245[0] - (0xff < sVar4));
        sVar4 = auVar245._4_2_;
        sVar5 = auVar245._6_2_;
        if (w == 2) {
          *(undefined2 *)dst = uVar249;
        }
        else {
          *(uint *)dst = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar245[6] - (0xff < sVar5),
                                  CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar245[4] -
                                           (0xff < sVar4),uVar249));
        }
        pauVar197 = (undefined1 (*) [16])(*pauVar197 + src_stride);
        dst = dst + dst_stride;
        h = h + -1;
      } while (h != 0);
    }
    else {
      uVar202 = 1;
      if (1 < h) {
        uVar202 = (ulong)(uint)h;
      }
      uVar199 = 0;
      do {
        uVar200 = 0;
        do {
          auVar245 = *(undefined1 (*) [16])(*pauVar197 + uVar200);
          uVar236 = auVar245[7];
          auVar28[0xd] = 0;
          auVar28._0_13_ = auVar245._0_13_;
          auVar28[0xe] = uVar236;
          uVar235 = auVar245[6];
          auVar42[0xc] = uVar235;
          auVar42._0_12_ = auVar245._0_12_;
          auVar42._13_2_ = auVar28._13_2_;
          auVar59[0xb] = 0;
          auVar59._0_11_ = auVar245._0_11_;
          auVar59._12_3_ = auVar42._12_3_;
          uVar234 = auVar245[5];
          auVar73[10] = uVar234;
          auVar73._0_10_ = auVar245._0_10_;
          auVar73._11_4_ = auVar59._11_4_;
          auVar89[9] = 0;
          auVar89._0_9_ = auVar245._0_9_;
          auVar89._10_5_ = auVar73._10_5_;
          uVar233 = auVar245[4];
          auVar102[8] = uVar233;
          auVar102._0_8_ = auVar245._0_8_;
          auVar102._9_6_ = auVar89._9_6_;
          auVar153._7_8_ = 0;
          auVar153._0_7_ = auVar102._8_7_;
          uVar232 = auVar245[3];
          auVar175._1_8_ = SUB158(auVar153 << 0x40,7);
          auVar175[0] = uVar232;
          auVar175._9_6_ = 0;
          auVar176._1_10_ = SUB1510(auVar175 << 0x30,5);
          auVar176[0] = auVar245[2];
          auVar176._11_4_ = 0;
          auVar116[2] = auVar245[1];
          auVar116._0_2_ = auVar245._0_2_;
          auVar116._3_12_ = SUB1512(auVar176 << 0x20,3);
          auVar229._0_2_ = auVar245._0_2_ & 0xff;
          auVar229._2_13_ = auVar116._2_13_;
          auVar229[0xf] = 0;
          uVar250 = auVar245[9];
          auVar29[0xd] = 0;
          auVar29._0_13_ = auVar245._2_13_;
          auVar29[0xe] = uVar250;
          uVar248 = auVar245[8];
          auVar43[0xc] = uVar248;
          auVar43._0_12_ = auVar245._2_12_;
          auVar43._13_2_ = auVar29._13_2_;
          auVar60[0xb] = 0;
          auVar60._0_11_ = auVar245._2_11_;
          auVar60._12_3_ = auVar43._12_3_;
          auVar74[10] = uVar236;
          auVar74._0_10_ = auVar245._2_10_;
          auVar74._11_4_ = auVar60._11_4_;
          auVar90[9] = 0;
          auVar90._0_9_ = auVar245._2_9_;
          auVar90._10_5_ = auVar74._10_5_;
          auVar103[8] = uVar235;
          auVar103._0_8_ = auVar245._2_8_;
          auVar103._9_6_ = auVar90._9_6_;
          auVar154._7_8_ = 0;
          auVar154._0_7_ = auVar103._8_7_;
          auVar177._1_8_ = SUB158(auVar154 << 0x40,7);
          auVar177[0] = uVar234;
          auVar177._9_6_ = 0;
          auVar178._1_10_ = SUB1510(auVar177 << 0x30,5);
          auVar178[0] = uVar233;
          auVar178._11_4_ = 0;
          auVar117[2] = uVar232;
          auVar117._0_2_ = auVar245._2_2_;
          auVar117._3_12_ = SUB1512(auVar178 << 0x20,3);
          auVar246._0_2_ = auVar245._2_2_ & 0xff;
          auVar246._2_13_ = auVar117._2_13_;
          auVar246[0xf] = 0;
          auVar257._0_12_ = auVar245._4_12_;
          auVar257._12_4_ = auVar245._12_4_;
          uVar264 = auVar245[0xb];
          auVar30[0xd] = 0;
          auVar30._0_13_ = auVar257._0_13_;
          auVar30[0xe] = uVar264;
          uVar262 = auVar245[10];
          auVar44[0xc] = uVar262;
          auVar44._0_12_ = auVar257._0_12_;
          auVar44._13_2_ = auVar30._13_2_;
          auVar61[0xb] = 0;
          auVar61._0_11_ = auVar245._4_11_;
          auVar61._12_3_ = auVar44._12_3_;
          auVar75[10] = uVar250;
          auVar75._0_10_ = auVar245._4_10_;
          auVar75._11_4_ = auVar61._11_4_;
          auVar91[9] = 0;
          auVar91._0_9_ = auVar245._4_9_;
          auVar91._10_5_ = auVar75._10_5_;
          auVar104[8] = uVar248;
          auVar104._0_8_ = auVar245._4_8_;
          auVar104._9_6_ = auVar91._9_6_;
          auVar155._7_8_ = 0;
          auVar155._0_7_ = auVar104._8_7_;
          auVar179._1_8_ = SUB158(auVar155 << 0x40,7);
          auVar179[0] = uVar236;
          auVar179._9_6_ = 0;
          auVar180._1_10_ = SUB1510(auVar179 << 0x30,5);
          auVar180[0] = uVar235;
          auVar180._11_4_ = 0;
          auVar118[2] = uVar234;
          auVar118._0_2_ = auVar245._4_2_;
          auVar118._3_12_ = SUB1512(auVar180 << 0x20,3);
          auVar258._0_2_ = auVar245._4_2_ & 0xff;
          auVar258._2_13_ = auVar118._2_13_;
          auVar258[0xf] = 0;
          auVar31 = auVar245._3_13_;
          auVar32[0xd] = 0;
          auVar32._0_13_ = auVar31 >> 0x18;
          auVar32[0xe] = auVar245[0xd];
          uVar219 = auVar245[0xc];
          auVar46[0xc] = uVar219;
          auVar46._0_12_ = auVar257._0_12_ >> 0x10;
          auVar46._13_2_ = auVar32._13_2_;
          auVar45 = auVar245._5_11_;
          auVar62[0xb] = 0;
          auVar62._0_11_ = auVar45 >> 8;
          auVar62._12_3_ = auVar46._12_3_;
          auVar76[10] = uVar264;
          auVar76._0_10_ = auVar245._6_10_;
          auVar76._11_4_ = auVar62._11_4_;
          auVar92[9] = 0;
          auVar92._0_9_ = auVar245._6_9_;
          auVar92._10_5_ = auVar76._10_5_;
          auVar105[8] = uVar262;
          auVar105._0_8_ = auVar245._6_8_;
          auVar105._9_6_ = auVar92._9_6_;
          auVar156._7_8_ = 0;
          auVar156._0_7_ = auVar105._8_7_;
          auVar181._1_8_ = SUB158(auVar156 << 0x40,7);
          auVar181[0] = uVar250;
          auVar181._9_6_ = 0;
          auVar182._1_10_ = SUB1510(auVar181 << 0x30,5);
          auVar182[0] = uVar248;
          auVar182._11_4_ = 0;
          auVar119[2] = uVar236;
          auVar119._0_2_ = auVar245._6_2_;
          auVar119._3_12_ = SUB1512(auVar182 << 0x20,3);
          auVar217._0_2_ = auVar245._6_2_ & 0xff;
          auVar217._2_13_ = auVar119._2_13_;
          auVar217[0xf] = 0;
          auVar254._4_4_ = uVar126;
          auVar254._0_4_ = uVar126;
          auVar254._8_4_ = uVar126;
          auVar254._12_4_ = uVar126;
          auVar229 = pmaddwd(auVar229,auVar254);
          auVar256._4_4_ = uVar127;
          auVar256._0_4_ = uVar127;
          auVar256._8_4_ = uVar127;
          auVar256._12_4_ = uVar127;
          auVar246 = pmaddwd(auVar246,auVar256);
          auVar277._4_4_ = uVar128;
          auVar277._0_4_ = uVar128;
          auVar277._8_4_ = uVar128;
          auVar277._12_4_ = uVar128;
          auVar277 = pmaddwd(auVar258,auVar277);
          auVar254 = pmaddwd(auVar217,auVar227);
          auVar33[0xd] = 0;
          auVar33._0_13_ = auVar245._1_13_;
          auVar33[0xe] = uVar248;
          auVar47[0xc] = uVar236;
          auVar47._0_12_ = auVar245._1_12_;
          auVar47._13_2_ = auVar33._13_2_;
          auVar63[0xb] = 0;
          auVar63._0_11_ = auVar245._1_11_;
          auVar63._12_3_ = auVar47._12_3_;
          auVar77[10] = uVar235;
          auVar77._0_10_ = auVar245._1_10_;
          auVar77._11_4_ = auVar63._11_4_;
          auVar93[9] = 0;
          auVar93._0_9_ = auVar245._1_9_;
          auVar93._10_5_ = auVar77._10_5_;
          auVar106[8] = uVar234;
          auVar106._0_8_ = auVar245._1_8_;
          auVar106._9_6_ = auVar93._9_6_;
          auVar157._7_8_ = 0;
          auVar157._0_7_ = auVar106._8_7_;
          auVar183._1_8_ = SUB158(auVar157 << 0x40,7);
          auVar183[0] = uVar233;
          auVar183._9_6_ = 0;
          auVar184._1_10_ = SUB1510(auVar183 << 0x30,5);
          auVar184[0] = uVar232;
          auVar184._11_4_ = 0;
          auVar120[2] = auVar245[2];
          auVar120._0_2_ = auVar245._1_2_;
          auVar120._3_12_ = SUB1512(auVar184 << 0x20,3);
          auVar230._0_2_ = auVar245._1_2_ & 0xff;
          auVar230._2_13_ = auVar120._2_13_;
          auVar230[0xf] = 0;
          auVar34[0xd] = 0;
          auVar34._0_13_ = auVar31;
          auVar34[0xe] = uVar262;
          auVar48[0xc] = uVar250;
          auVar48._0_12_ = auVar245._3_12_;
          auVar48._13_2_ = auVar34._13_2_;
          auVar64[0xb] = 0;
          auVar64._0_11_ = auVar245._3_11_;
          auVar64._12_3_ = auVar48._12_3_;
          auVar78[10] = uVar248;
          auVar78._0_10_ = auVar245._3_10_;
          auVar78._11_4_ = auVar64._11_4_;
          auVar94[9] = 0;
          auVar94._0_9_ = auVar245._3_9_;
          auVar94._10_5_ = auVar78._10_5_;
          auVar107[8] = uVar236;
          auVar107._0_8_ = auVar245._3_8_;
          auVar107._9_6_ = auVar94._9_6_;
          auVar158._7_8_ = 0;
          auVar158._0_7_ = auVar107._8_7_;
          auVar185._1_8_ = SUB158(auVar158 << 0x40,7);
          auVar185[0] = uVar235;
          auVar185._9_6_ = 0;
          auVar186._1_10_ = SUB1510(auVar185 << 0x30,5);
          auVar186[0] = uVar234;
          auVar186._11_4_ = 0;
          auVar121[2] = uVar233;
          auVar121._0_2_ = auVar245._3_2_;
          auVar121._3_12_ = SUB1512(auVar186 << 0x20,3);
          auVar247._0_2_ = auVar245._3_2_ & 0xff;
          auVar247._2_13_ = auVar121._2_13_;
          auVar247[0xf] = 0;
          auVar35[0xd] = 0;
          auVar35._0_13_ = auVar31 >> 0x10;
          auVar35[0xe] = uVar219;
          auVar49[0xc] = uVar264;
          auVar49._0_12_ = auVar257._0_12_ >> 8;
          auVar49._13_2_ = auVar35._13_2_;
          auVar65[0xb] = 0;
          auVar65._0_11_ = auVar45;
          auVar65._12_3_ = auVar49._12_3_;
          auVar79[10] = uVar262;
          auVar79._0_10_ = auVar245._5_10_;
          auVar79._11_4_ = auVar65._11_4_;
          auVar95[9] = 0;
          auVar95._0_9_ = auVar245._5_9_;
          auVar95._10_5_ = auVar79._10_5_;
          auVar108[8] = uVar250;
          auVar108._0_8_ = auVar245._5_8_;
          auVar108._9_6_ = auVar95._9_6_;
          auVar159._7_8_ = 0;
          auVar159._0_7_ = auVar108._8_7_;
          auVar187._1_8_ = SUB158(auVar159 << 0x40,7);
          auVar187[0] = uVar248;
          auVar187._9_6_ = 0;
          auVar188._1_10_ = SUB1510(auVar187 << 0x30,5);
          auVar188[0] = uVar236;
          auVar188._11_4_ = 0;
          auVar122[2] = uVar235;
          auVar122._0_2_ = auVar245._5_2_;
          auVar122._3_12_ = SUB1512(auVar188 << 0x20,3);
          auVar259._0_2_ = auVar245._5_2_ & 0xff;
          auVar259._2_13_ = auVar122._2_13_;
          auVar259[0xf] = 0;
          auVar36[0xd] = 0;
          auVar36._0_13_ = auVar31 >> 0x20;
          auVar36[0xe] = auVar245[0xe];
          auVar50[0xc] = auVar245[0xd];
          auVar50._0_12_ = auVar257._0_12_ >> 0x18;
          auVar50._13_2_ = auVar36._13_2_;
          auVar66[0xb] = 0;
          auVar66._0_11_ = auVar45 >> 0x10;
          auVar66._12_3_ = auVar50._12_3_;
          auVar80[10] = uVar219;
          auVar80._0_10_ = auVar245._6_10_ >> 8;
          auVar80._11_4_ = auVar66._11_4_;
          auVar96[9] = 0;
          auVar96._0_9_ = auVar245._7_9_;
          auVar96._10_5_ = auVar80._10_5_;
          auVar109[8] = uVar264;
          auVar109._0_8_ = auVar245._7_8_;
          auVar109._9_6_ = auVar96._9_6_;
          auVar160._7_8_ = 0;
          auVar160._0_7_ = auVar109._8_7_;
          auVar189._1_8_ = SUB158(auVar160 << 0x40,7);
          auVar189[0] = uVar262;
          auVar189._9_6_ = 0;
          auVar190._1_10_ = SUB1510(auVar189 << 0x30,5);
          auVar190[0] = uVar250;
          auVar190._11_4_ = 0;
          auVar123[2] = uVar248;
          auVar123._0_2_ = auVar245._7_2_;
          auVar123._3_12_ = SUB1512(auVar190 << 0x20,3);
          auVar221._0_2_ = auVar245._7_2_ & 0xff;
          auVar221._2_13_ = auVar123._2_13_;
          auVar221[0xf] = 0;
          auVar245._4_4_ = uVar126;
          auVar245._0_4_ = uVar126;
          auVar245._8_4_ = uVar126;
          auVar245._12_4_ = uVar126;
          auVar256 = pmaddwd(auVar230,auVar245);
          auVar271._4_4_ = uVar127;
          auVar271._0_4_ = uVar127;
          auVar271._8_4_ = uVar127;
          auVar271._12_4_ = uVar127;
          auVar271 = pmaddwd(auVar247,auVar271);
          auVar260._4_4_ = uVar128;
          auVar260._0_4_ = uVar128;
          auVar260._8_4_ = uVar128;
          auVar260._12_4_ = uVar128;
          auVar260 = pmaddwd(auVar259,auVar260);
          auVar245 = pmaddwd(auVar221,auVar227);
          auVar231._0_4_ =
               (auVar254._0_4_ + auVar277._0_4_ + auVar246._0_4_ + auVar229._0_4_ + iVar203 >>
               auVar205) + iVar204 >> auVar206;
          auVar231._4_4_ =
               (auVar245._0_4_ + auVar260._0_4_ + auVar271._0_4_ + auVar256._0_4_ + iVar203 >>
               auVar205) + iVar204 >> auVar206;
          auVar231._8_4_ =
               (auVar254._4_4_ + auVar277._4_4_ + auVar246._4_4_ + auVar229._4_4_ + iVar203 >>
               auVar205) + iVar204 >> auVar206;
          auVar231._12_4_ =
               (auVar245._4_4_ + auVar260._4_4_ + auVar271._4_4_ + auVar256._4_4_ + iVar203 >>
               auVar205) + iVar204 >> auVar206;
          auVar218._0_4_ =
               (auVar254._8_4_ + auVar277._8_4_ + auVar246._8_4_ + auVar229._8_4_ + iVar203 >>
               auVar205) + iVar204 >> auVar206;
          auVar218._4_4_ =
               (auVar245._8_4_ + auVar260._8_4_ + auVar271._8_4_ + auVar256._8_4_ + iVar203 >>
               auVar205) + iVar204 >> auVar206;
          auVar218._8_4_ =
               (auVar254._12_4_ + auVar277._12_4_ + auVar246._12_4_ + auVar229._12_4_ + iVar203 >>
               auVar205) + iVar204 >> auVar206;
          auVar218._12_4_ =
               (auVar245._12_4_ + auVar260._12_4_ + auVar271._12_4_ + auVar256._12_4_ + iVar203 >>
               auVar205) + iVar204 >> auVar206;
          auVar245 = packssdw(auVar231,auVar218);
          sVar4 = auVar245._0_2_;
          sVar5 = auVar245._2_2_;
          sVar6 = auVar245._4_2_;
          sVar7 = auVar245._6_2_;
          sVar8 = auVar245._8_2_;
          sVar9 = auVar245._10_2_;
          sVar10 = auVar245._12_2_;
          sVar11 = auVar245._14_2_;
          *(ulong *)(dst + uVar200) =
               CONCAT17((0 < sVar11) * (sVar11 < 0x100) * auVar245[0xe] - (0xff < sVar11),
                        CONCAT16((0 < sVar10) * (sVar10 < 0x100) * auVar245[0xc] - (0xff < sVar10),
                                 CONCAT15((0 < sVar9) * (sVar9 < 0x100) * auVar245[10] -
                                          (0xff < sVar9),
                                          CONCAT14((0 < sVar8) * (sVar8 < 0x100) * auVar245[8] -
                                                   (0xff < sVar8),
                                                   CONCAT13((0 < sVar7) * (sVar7 < 0x100) *
                                                            auVar245[6] - (0xff < sVar7),
                                                            CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                                     auVar245[4] - (0xff < sVar6),
                                                                     CONCAT11((0 < sVar5) *
                                                                              (sVar5 < 0x100) *
                                                                              auVar245[2] -
                                                                              (0xff < sVar5),
                                                                              (0 < sVar4) *
                                                                              (sVar4 < 0x100) *
                                                                              auVar245[0] -
                                                                              (0xff < sVar4))))))));
          uVar200 = uVar200 + 8;
        } while (uVar200 < (uint)w);
        uVar199 = uVar199 + 1;
        pauVar197 = (undefined1 (*) [16])(*pauVar197 + src_stride);
        dst = dst + dst_stride;
      } while (uVar199 != uVar202);
    }
  }
  else {
    if (w < 4) {
      av1_convolve_x_sr_c(src,src_stride,dst,dst_stride,w,h,filter_params_x,subpel_x_qn,conv_params)
      ;
      return;
    }
    puVar198 = src + (1 - (ulong)(uVar261 >> 1));
    uVar201 = 7 - conv_params->round_0;
    iVar203 = (1 << ((byte)conv_params->round_0 & 0x1f)) >> 1;
    iVar204 = (1 << ((byte)uVar201 & 0x1f)) >> 1;
    auVar205 = ZEXT416((uint)conv_params->round_0);
    auVar206 = ZEXT416(uVar201);
    uVar202 = (ulong)((subpel_x_qn & 0xfU) * (uint)uVar261);
    piVar1 = filter_params_x->filter_ptr + uVar202;
    uVar126 = *(undefined4 *)piVar1;
    uVar127 = *(undefined4 *)(piVar1 + 2);
    uVar128 = *(undefined4 *)(piVar1 + 4);
    uVar209 = *(undefined4 *)(piVar1 + 6);
    auVar207._4_4_ = uVar209;
    auVar207._0_4_ = uVar209;
    auVar207._8_4_ = uVar209;
    auVar207._12_4_ = uVar209;
    uVar2 = *(undefined8 *)(filter_params_x->filter_ptr + uVar202 + 8);
    uVar209 = (undefined4)uVar2;
    auVar216._4_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    auVar208._4_4_ = uVar209;
    auVar208._0_4_ = uVar209;
    auVar208._8_4_ = uVar209;
    auVar208._12_4_ = uVar209;
    auVar216._0_4_ = auVar216._4_4_;
    auVar216._8_4_ = auVar216._4_4_;
    auVar216._12_4_ = auVar216._4_4_;
    uVar202 = 1;
    if (1 < h) {
      uVar202 = (ulong)(uint)h;
    }
    uVar199 = 0;
    do {
      uVar200 = 0;
      do {
        auVar227 = *(undefined1 (*) [16])(puVar198 + uVar200);
        uVar219 = auVar227[7];
        uVar263 = auVar227._6_2_;
        auVar18._12_2_ = uVar263;
        auVar18._0_12_ = auVar227._0_12_;
        auVar18[0xe] = uVar219;
        auVar19._10_2_ = auVar227._5_2_;
        auVar19._0_10_ = auVar227._0_10_;
        auVar19._12_3_ = auVar18._12_3_;
        uVar261 = auVar227._4_2_;
        auVar23._8_2_ = uVar261;
        auVar23._0_8_ = auVar227._0_8_;
        auVar23._10_5_ = auVar19._10_5_;
        auVar142._2_7_ = auVar23._8_7_;
        auVar142._0_2_ = auVar227._3_2_;
        auVar142._9_6_ = 0;
        auVar68._11_4_ = 0;
        auVar68._0_11_ = SUB1511(auVar142 << 0x30,4);
        auVar68 = auVar68 << 0x20;
        auVar143[4] = uVar219;
        auVar143._2_2_ = uVar263;
        auVar143._0_2_ = auVar227._5_2_;
        auVar143._5_6_ = 0;
        uVar84 = SUB117(auVar143 << 0x30,4);
        auVar45._7_4_ = 0;
        auVar45._0_7_ = uVar84;
        auVar45 = auVar45 << 0x20;
        auVar238._0_8_ = auVar227._4_8_;
        auVar238._8_4_ = auVar227._8_4_;
        uVar249 = auVar227._10_2_;
        auVar243._12_2_ = uVar249;
        auVar243._0_12_ = auVar238;
        auVar243._14_2_ = auVar227._11_2_;
        auVar242._12_4_ = auVar243._12_4_;
        auVar242._0_10_ = auVar238._0_10_;
        auVar242._10_2_ = auVar227._9_2_;
        auVar241._10_6_ = auVar242._10_6_;
        auVar241._8_2_ = auVar227._8_2_;
        auVar241._0_8_ = auVar238._0_8_;
        auVar144._2_8_ = auVar241._8_8_;
        auVar144._0_2_ = auVar227._7_2_;
        auVar144._10_6_ = 0;
        auVar240._12_4_ = 0;
        auVar240._0_12_ = SUB1612(auVar144 << 0x30,4);
        auVar240 = auVar240 << 0x20;
        auVar225._0_12_ = auVar227._4_12_ >> 0x10;
        auVar225._12_2_ = auVar227._12_2_;
        auVar225._14_2_ = auVar227._13_2_;
        auVar224._12_4_ = auVar225._12_4_;
        auVar224._0_10_ = auVar227._6_10_;
        auVar224._10_2_ = auVar227._11_2_;
        auVar223._10_6_ = auVar224._10_6_;
        auVar223._0_8_ = auVar227._6_8_;
        auVar223._8_2_ = uVar249;
        auVar145._2_8_ = auVar223._8_8_;
        auVar145._0_2_ = auVar227._9_2_;
        auVar145._10_6_ = 0;
        auVar222._12_4_ = 0;
        auVar222._0_12_ = SUB1612(auVar145 << 0x30,4);
        auVar222 = auVar222 << 0x20;
        uVar233 = auVar227[4];
        auVar24[0xd] = 0;
        auVar24._0_13_ = auVar68._0_13_;
        auVar24[0xe] = uVar233;
        uVar232 = auVar227[3];
        auVar38[0xc] = uVar232;
        auVar38._0_12_ = auVar68._0_12_;
        auVar38._13_2_ = auVar24._13_2_;
        auVar55[0xb] = 0;
        auVar55._0_11_ = auVar68._0_11_;
        auVar55._12_3_ = auVar38._12_3_;
        auVar69[10] = uVar232;
        auVar69._0_10_ = auVar68._0_10_;
        auVar69._11_4_ = auVar55._11_4_;
        auVar85[9] = 0;
        auVar85._0_9_ = auVar68._0_9_;
        auVar85._10_5_ = auVar69._10_5_;
        auVar98[8] = auVar227[2];
        auVar98._0_8_ = auVar68._0_8_;
        auVar98._9_6_ = auVar85._9_6_;
        auVar146._7_8_ = 0;
        auVar146._0_7_ = auVar98._8_7_;
        auVar167._1_8_ = SUB158(auVar146 << 0x40,7);
        auVar167[0] = auVar227[2];
        auVar167._9_6_ = 0;
        auVar168._1_10_ = SUB1510(auVar167 << 0x30,5);
        auVar168[0] = auVar227[1];
        auVar168._11_4_ = 0;
        auVar112[2] = auVar227[1];
        auVar112._0_2_ = auVar227._0_2_;
        auVar112._3_12_ = SUB1512(auVar168 << 0x20,3);
        auVar253._0_2_ = auVar227._0_2_ & 0xff;
        auVar253._2_13_ = auVar112._2_13_;
        auVar253[0xf] = 0;
        auVar12._4_4_ = uVar126;
        auVar12._0_4_ = uVar126;
        auVar12._8_4_ = uVar126;
        auVar12._12_4_ = uVar126;
        auVar254 = pmaddwd(auVar253,auVar12);
        uVar235 = auVar227[6];
        auVar149._7_7_ = 0;
        auVar149._0_7_ = uVar84;
        auVar25[0xe] = uVar235;
        auVar25._0_14_ = auVar149 << 0x20;
        uVar234 = auVar227[5];
        auVar148._7_5_ = 0;
        auVar148._0_7_ = uVar84;
        auVar39[0xc] = uVar234;
        auVar39._0_12_ = auVar148 << 0x20;
        auVar39._13_2_ = auVar25._13_2_;
        auVar147._7_5_ = 0;
        auVar147._0_7_ = uVar84;
        auVar56._12_3_ = auVar39._12_3_;
        auVar56._0_12_ = auVar147 << 0x20;
        auVar70[10] = uVar234;
        auVar70._0_10_ = auVar45._0_10_;
        auVar70._11_4_ = auVar56._11_4_;
        auVar86[9] = 0;
        auVar86._0_9_ = auVar45._0_9_;
        auVar86._10_5_ = auVar70._10_5_;
        auVar99[8] = uVar233;
        auVar99._0_8_ = auVar45._0_8_;
        auVar99._9_6_ = auVar86._9_6_;
        auVar150._7_8_ = 0;
        auVar150._0_7_ = auVar99._8_7_;
        auVar169._1_8_ = SUB158(auVar150 << 0x40,7);
        auVar169[0] = uVar233;
        auVar169._9_6_ = 0;
        auVar170._1_10_ = SUB1510(auVar169 << 0x30,5);
        auVar170[0] = uVar232;
        auVar170._11_4_ = 0;
        auVar113[2] = uVar232;
        auVar113._0_2_ = auVar227._2_2_;
        auVar113._3_12_ = SUB1512(auVar170 << 0x20,3);
        auVar270._0_2_ = auVar227._2_2_ & 0xff;
        auVar270._2_13_ = auVar113._2_13_;
        auVar270[0xf] = 0;
        auVar14._4_4_ = uVar127;
        auVar14._0_4_ = uVar127;
        auVar14._8_4_ = uVar127;
        auVar14._12_4_ = uVar127;
        auVar271 = pmaddwd(auVar270,auVar14);
        uVar236 = auVar227[8];
        auVar26[0xd] = 0;
        auVar26._0_13_ = auVar240._0_13_;
        auVar26[0xe] = uVar236;
        auVar40[0xc] = uVar219;
        auVar40._0_12_ = auVar240._0_12_;
        auVar40._13_2_ = auVar26._13_2_;
        auVar57[0xb] = 0;
        auVar57._0_11_ = auVar240._0_11_;
        auVar57._12_3_ = auVar40._12_3_;
        auVar71[10] = uVar219;
        auVar71._0_10_ = auVar240._0_10_;
        auVar71._11_4_ = auVar57._11_4_;
        auVar87[9] = 0;
        auVar87._0_9_ = auVar240._0_9_;
        auVar87._10_5_ = auVar71._10_5_;
        auVar100[8] = uVar235;
        auVar100._0_8_ = auVar240._0_8_;
        auVar100._9_6_ = auVar87._9_6_;
        auVar151._7_8_ = 0;
        auVar151._0_7_ = auVar100._8_7_;
        auVar171._1_8_ = SUB158(auVar151 << 0x40,7);
        auVar171[0] = uVar235;
        auVar171._9_6_ = 0;
        auVar172._1_10_ = SUB1510(auVar171 << 0x30,5);
        auVar172[0] = uVar234;
        auVar172._11_4_ = 0;
        auVar114[2] = uVar234;
        auVar114._0_2_ = uVar261;
        auVar114._3_12_ = SUB1512(auVar172 << 0x20,3);
        auVar276._0_2_ = uVar261 & 0xff;
        auVar276._2_13_ = auVar114._2_13_;
        auVar276[0xf] = 0;
        auVar16._4_4_ = uVar128;
        auVar16._0_4_ = uVar128;
        auVar16._8_4_ = uVar128;
        auVar16._12_4_ = uVar128;
        auVar277 = pmaddwd(auVar276,auVar16);
        uVar233 = auVar227[10];
        auVar27[0xd] = 0;
        auVar27._0_13_ = auVar222._0_13_;
        auVar27[0xe] = uVar233;
        uVar232 = auVar227[9];
        auVar41[0xc] = uVar232;
        auVar41._0_12_ = auVar222._0_12_;
        auVar41._13_2_ = auVar27._13_2_;
        auVar58[0xb] = 0;
        auVar58._0_11_ = auVar222._0_11_;
        auVar58._12_3_ = auVar41._12_3_;
        auVar72[10] = uVar232;
        auVar72._0_10_ = auVar222._0_10_;
        auVar72._11_4_ = auVar58._11_4_;
        auVar88[9] = 0;
        auVar88._0_9_ = auVar222._0_9_;
        auVar88._10_5_ = auVar72._10_5_;
        auVar101[8] = uVar236;
        auVar101._0_8_ = auVar222._0_8_;
        auVar101._9_6_ = auVar88._9_6_;
        auVar152._7_8_ = 0;
        auVar152._0_7_ = auVar101._8_7_;
        auVar173._1_8_ = SUB158(auVar152 << 0x40,7);
        auVar173[0] = uVar236;
        auVar173._9_6_ = 0;
        auVar174._1_10_ = SUB1510(auVar173 << 0x30,5);
        auVar174[0] = uVar219;
        auVar174._11_4_ = 0;
        auVar115[2] = uVar219;
        auVar115._0_2_ = uVar263;
        auVar115._3_12_ = SUB1512(auVar174 << 0x20,3);
        auVar255._0_2_ = uVar263 & 0xff;
        auVar255._2_13_ = auVar115._2_13_;
        auVar255[0xf] = 0;
        auVar256 = pmaddwd(auVar255,auVar207);
        auVar244._0_3_ = CONCAT12(uVar232,auVar227._8_2_) & 0xff00ff;
        auVar244[3] = 0;
        auVar244[4] = uVar232;
        auVar244[5] = 0;
        auVar244[6] = uVar233;
        auVar244[7] = 0;
        auVar244[8] = uVar233;
        auVar244[9] = 0;
        uVar219 = auVar227[0xb];
        auVar244[10] = uVar219;
        auVar244[0xb] = 0;
        auVar244[0xc] = uVar219;
        auVar244[0xd] = 0;
        uVar232 = auVar227[0xc];
        auVar244[0xe] = uVar232;
        auVar244[0xf] = 0;
        auVar245 = pmaddwd(auVar244,auVar208);
        auVar226._0_3_ = CONCAT12(uVar219,uVar249) & 0xff00ff;
        auVar226[3] = 0;
        auVar226[4] = uVar219;
        auVar226[5] = 0;
        auVar226[6] = uVar232;
        auVar226[7] = 0;
        auVar226[8] = uVar232;
        auVar226[9] = 0;
        auVar226[10] = auVar227[0xd];
        auVar226[0xb] = 0;
        auVar226[0xc] = auVar227[0xd];
        auVar226[0xd] = 0;
        auVar226[0xe] = auVar227[0xe];
        auVar226[0xf] = 0;
        auVar227 = pmaddwd(auVar226,auVar216);
        auVar228._0_4_ =
             (auVar227._0_4_ + auVar245._0_4_ + auVar256._0_4_ +
              auVar277._0_4_ + auVar271._0_4_ + auVar254._0_4_ + iVar203 >> auVar205) + iVar204 >>
             auVar206;
        auVar228._4_4_ =
             (auVar227._4_4_ + auVar245._4_4_ + auVar256._4_4_ +
              auVar277._4_4_ + auVar271._4_4_ + auVar254._4_4_ + iVar203 >> auVar205) + iVar204 >>
             auVar206;
        auVar228._8_4_ =
             (auVar227._8_4_ + auVar245._8_4_ + auVar256._8_4_ +
              auVar277._8_4_ + auVar271._8_4_ + auVar254._8_4_ + iVar203 >> auVar205) + iVar204 >>
             auVar206;
        auVar228._12_4_ =
             (auVar227._12_4_ + auVar245._12_4_ + auVar256._12_4_ +
              auVar277._12_4_ + auVar271._12_4_ + auVar254._12_4_ + iVar203 >> auVar205) + iVar204
             >> auVar206;
        auVar227 = packssdw(auVar228,auVar228);
        sVar4 = auVar227._0_2_;
        sVar5 = auVar227._2_2_;
        sVar6 = auVar227._4_2_;
        sVar7 = auVar227._6_2_;
        *(uint *)(dst + uVar200) =
             CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar227[6] - (0xff < sVar7),
                      CONCAT12((0 < sVar6) * (sVar6 < 0x100) * auVar227[4] - (0xff < sVar6),
                               CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar227[2] - (0xff < sVar5)
                                        ,(0 < sVar4) * (sVar4 < 0x100) * auVar227[0] -
                                         (0xff < sVar4))));
        uVar200 = uVar200 + 4;
      } while (uVar200 < (uint)w);
      uVar199 = uVar199 + 1;
      dst = dst + dst_stride;
      puVar198 = puVar198 + src_stride;
    } while (uVar199 != uVar202);
  }
  return;
}

Assistant:

void av1_convolve_x_sr_sse2(const uint8_t *src, int src_stride, uint8_t *dst,
                            int dst_stride, int w, int h,
                            const InterpFilterParams *filter_params_x,
                            const int subpel_x_qn,
                            ConvolveParams *conv_params) {
  if (filter_params_x->taps > 8) {
    if (w < 4) {
      av1_convolve_x_sr_c(src, src_stride, dst, dst_stride, w, h,
                          filter_params_x, subpel_x_qn, conv_params);
    } else {
      convolve_x_sr_12tap_sse2(src, src_stride, dst, dst_stride, w, h,
                               filter_params_x, subpel_x_qn, conv_params);
    }
  } else {
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *src_ptr = src - fo_horiz;
    const int bits = FILTER_BITS - conv_params->round_0;
    const __m128i round_0_const =
        _mm_set1_epi32((1 << conv_params->round_0) >> 1);
    const __m128i round_const = _mm_set1_epi32((1 << bits) >> 1);
    const __m128i round_0_shift = _mm_cvtsi32_si128(conv_params->round_0);
    const __m128i round_shift = _mm_cvtsi32_si128(bits);
    __m128i coeffs[4];

    assert(bits >= 0);
    assert((FILTER_BITS - conv_params->round_1) >= 0 ||
           ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

    prepare_coeffs(filter_params_x, subpel_x_qn, coeffs);

    if (w <= 4) {
      do {
        const __m128i data = _mm_loadu_si128((__m128i *)src_ptr);
        __m128i s[4];

        s[0] = _mm_unpacklo_epi8(data, _mm_srli_si128(data, 1));
        s[1] =
            _mm_unpacklo_epi8(_mm_srli_si128(data, 2), _mm_srli_si128(data, 3));
        s[2] =
            _mm_unpacklo_epi8(_mm_srli_si128(data, 4), _mm_srli_si128(data, 5));
        s[3] =
            _mm_unpacklo_epi8(_mm_srli_si128(data, 6), _mm_srli_si128(data, 7));
        const __m128i res_lo = convolve_lo_x(s, coeffs);
        __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_0_const), round_0_shift);
        res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                     round_shift);

        const __m128i res16 = _mm_packs_epi32(res_lo_round, res_lo_round);
        const __m128i res = _mm_packus_epi16(res16, res16);

        int r = _mm_cvtsi128_si32(res);
        if (w == 2)
          *(uint16_t *)dst = (uint16_t)r;
        else
          *(int *)dst = r;

        src_ptr += src_stride;
        dst += dst_stride;
      } while (--h);
    } else {
      assert(!(w % 8));
      int i = 0;
      do {
        int j = 0;
        do {
          const __m128i data =
              _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
          __m128i s[4];

          // Filter even-index pixels
          s[0] = data;
          s[1] = _mm_srli_si128(data, 2);
          s[2] = _mm_srli_si128(data, 4);
          s[3] = _mm_srli_si128(data, 6);
          const __m128i res_even = convolve_lo_x(s, coeffs);

          // Filter odd-index pixels
          s[0] = _mm_srli_si128(data, 1);
          s[1] = _mm_srli_si128(data, 3);
          s[2] = _mm_srli_si128(data, 5);
          s[3] = _mm_srli_si128(data, 7);
          const __m128i res_odd = convolve_lo_x(s, coeffs);

          // Rearrange pixels back into the order 0 ... 7
          const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
          const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);
          __m128i res_lo_round = _mm_sra_epi32(
              _mm_add_epi32(res_lo, round_0_const), round_0_shift);
          res_lo_round = _mm_sra_epi32(_mm_add_epi32(res_lo_round, round_const),
                                       round_shift);
          __m128i res_hi_round = _mm_sra_epi32(
              _mm_add_epi32(res_hi, round_0_const), round_0_shift);
          res_hi_round = _mm_sra_epi32(_mm_add_epi32(res_hi_round, round_const),
                                       round_shift);

          const __m128i res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          const __m128i res = _mm_packus_epi16(res16, res16);

          _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
          j += 8;
        } while (j < w);
      } while (++i < h);
    }
  }
}